

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O1

bool Utilities::parseNumber<double>(string *s,double *x)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  long local_1a0;
  stringstream ss;
  byte abStack_180 [96];
  ios_base local_120 [264];
  
  pcVar3 = (s->_M_dataplus)._M_p;
  cVar1 = *pcVar3;
  pcVar4 = pcVar3 + (cVar1 == '-');
  dVar7 = 0.0;
  cVar2 = pcVar3[cVar1 == '-'];
  while ((byte)(cVar2 - 0x30U) < 10) {
    dVar7 = dVar7 * 10.0 + (double)(byte)(cVar2 - 0x30);
    pcVar3 = pcVar4 + 1;
    pcVar4 = pcVar4 + 1;
    cVar2 = *pcVar3;
  }
  if (cVar2 == '.') {
    cVar2 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
    if ((byte)(cVar2 - 0x30U) < 10) {
      dVar8 = 0.0;
      iVar5 = 0;
      do {
        dVar8 = dVar8 * 10.0 + (double)(byte)(cVar2 - 0x30);
        iVar5 = iVar5 + 1;
        cVar2 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      } while ((byte)(cVar2 - 0x30U) < 10);
    }
    else {
      iVar5 = 0;
      dVar8 = 0.0;
    }
    if (0 < iVar5) {
      iVar5 = iVar5 + 1;
      do {
        dVar8 = dVar8 / 10.0;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
    dVar7 = dVar7 + dVar8;
  }
  if (cVar1 == '-') {
    dVar7 = -dVar7;
  }
  *x = dVar7;
  if (*pcVar4 == '\0') {
    bVar6 = true;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0,(string *)s,_S_out|_S_in);
    std::istream::_M_extract<double>((double *)&local_1a0);
    bVar6 = (abStack_180[*(long *)(local_1a0 + -0x18)] & 5) == 0;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return bVar6;
}

Assistant:

static bool parseNumber(const std::string& s, T &x)
    {
        const char* p = s.c_str();
        T r = 0.0;
        bool neg = false;
        if (*p == '-') {
            neg = true;
            ++p;
        }
        while (*p >= '0' && *p <= '9') {
            r = (r*10.0) + (*p - '0');
            ++p;
        }
        if (*p == '.') {
            T f = 0.0;
            int n = 0;
            ++p;
            while (*p >= '0' && *p <= '9') {
                f = (f*10.0) + (*p - '0');
                ++p;
                ++n;
            }

            while (n > 0)
            {
                f = f / 10.0;
                n--;
            }

            r += f;
        }
        if (neg) {
            r = -r;
        }

        x = r;

        if (*p == '\0')
            return true;

        // for some numbers in scientific notation 
        std::stringstream ss(s);
        ss >> x;
        return !ss.fail();
    }